

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::SEES_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,SEES_PDU *this)

{
  KString *pKVar1;
  ostream *poVar2;
  ulong uVar3;
  ushort uVar4;
  pointer pPVar5;
  pointer pVVar6;
  KStringStream ss;
  char local_3a9;
  KString *local_3a8;
  KString local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  KString local_360;
  ostream *local_340;
  long local_338;
  long local_330 [14];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-SEES PDU-\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Originating Entity ID:\n",0x17);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3a0,&this->m_OriginatingEntity);
  local_3a8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
  local_3a9 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
  if (local_3a0._M_string_length != 0) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      local_3a9 = local_3a0._M_dataplus._M_p[uVar3];
      if ((local_3a0._M_string_length - 1 == uVar3) || (local_3a9 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
      }
      else {
        local_3a9 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
        local_3a9 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
      }
      uVar3 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar3 < local_3a0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"IR Signature Representation Index:                  ",0x34);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Acosutic Signature Representation Index:            ",0x34);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Radar Cross Section Signature Representation Index: ",0x34);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Number Of Propulsion Systems:                       ",0x34);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Number Of Vectoring Nozzle Systems:                 ",0x34);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pPVar5 = (this->m_vPropSys).
           super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar5 != (this->m_vPropSys).
                super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      (*(pPVar5->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_340,pPVar5);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_340,local_338);
      if (local_340 != (ostream *)local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 != (this->m_vPropSys).
                       super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pVVar6 = (this->m_vVecNozzleSys).
           super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar6 != (this->m_vVecNozzleSys).
                super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      (*(pVVar6->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_340,pVVar6);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_340,local_338);
      if (local_340 != (ostream *)local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != (this->m_vVecNozzleSys).
                       super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pKVar1 = local_3a8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar1;
}

Assistant:

KString SEES_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-SEES PDU-\n"
       << "Originating Entity ID:\n"
       << IndentString( m_OriginatingEntity.GetAsString(), 1 )
       << "IR Signature Representation Index:                  " << m_ui16IrSigRepIndex         << "\n"
       << "Acosutic Signature Representation Index:            " << m_ui16AcousticSigRepIndex   << "\n"
       << "Radar Cross Section Signature Representation Index: " << m_ui16CrossSection          << "\n"
       << "Number Of Propulsion Systems:                       " << m_ui16NumPropulsionSys      << "\n"
       << "Number Of Vectoring Nozzle Systems:                 " << m_ui16NumVectoringNozzleSys << "\n";

    vector<PropulsionSystem>::const_iterator citrPS = m_vPropSys.begin();

    for( ; citrPS != m_vPropSys.end(); ++citrPS )
    {
        ss << citrPS->GetAsString();
    }

    vector<VectoringNozzleSystem>::const_iterator citrVNS = m_vVecNozzleSys.begin();

    for( ; citrVNS != m_vVecNozzleSys.end(); ++citrVNS )
    {
        ss << citrVNS->GetAsString();
    }

    return ss.str();
}